

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

void picojson::serialize_str<std::back_insert_iterator<std::__cxx11::string>>
               (string *s,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               oi)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  long lVar4;
  undefined1 *local_50;
  char buf [7];
  undefined1 local_40 [16];
  
  cVar2 = (char)oi.container;
  std::__cxx11::string::push_back(cVar2);
  if (s->_M_string_length != 0) {
    pbVar3 = (byte *)(s->_M_dataplus)._M_p;
    do {
      bVar1 = *pbVar3;
      if (0x21 < bVar1) {
        if (bVar1 == 0x5c) {
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\\\","");
          if (0 < _buf) {
            lVar4 = _buf + 1;
            do {
              std::__cxx11::string::push_back(cVar2);
              lVar4 = lVar4 + -1;
            } while (1 < lVar4);
          }
        }
        else if (bVar1 == 0x2f) {
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\/","");
          if (0 < _buf) {
            lVar4 = _buf + 1;
            do {
              std::__cxx11::string::push_back(cVar2);
              lVar4 = lVar4 + -1;
            } while (1 < lVar4);
          }
        }
        else {
          if (bVar1 != 0x22) goto switchD_00118754_caseD_b;
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\\"","");
          if (0 < _buf) {
            lVar4 = _buf + 1;
            do {
              std::__cxx11::string::push_back(cVar2);
              lVar4 = lVar4 + -1;
            } while (1 < lVar4);
          }
        }
        goto LAB_001189c1;
      }
      switch(bVar1) {
      case 8:
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\b","");
        if (0 < _buf) {
          lVar4 = _buf + 1;
          do {
            std::__cxx11::string::push_back(cVar2);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        break;
      case 9:
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\t","");
        if (0 < _buf) {
          lVar4 = _buf + 1;
          do {
            std::__cxx11::string::push_back(cVar2);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        break;
      case 10:
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\n","");
        if (0 < _buf) {
          lVar4 = _buf + 1;
          do {
            std::__cxx11::string::push_back(cVar2);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        break;
      default:
switchD_00118754_caseD_b:
        if (bVar1 < 0x20 || bVar1 == 0x7f) {
          snprintf((char *)&local_50,7,"\\u%04x",(ulong)*pbVar3);
          lVar4 = 0;
          do {
            std::__cxx11::string::push_back(cVar2);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 6);
        }
        else {
          std::__cxx11::string::push_back(cVar2);
        }
        goto LAB_001189d3;
      case 0xc:
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\f","");
        if (0 < _buf) {
          lVar4 = _buf + 1;
          do {
            std::__cxx11::string::push_back(cVar2);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
        break;
      case 0xd:
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\r","");
        if (0 < _buf) {
          lVar4 = _buf + 1;
          do {
            std::__cxx11::string::push_back(cVar2);
            lVar4 = lVar4 + -1;
          } while (1 < lVar4);
        }
      }
LAB_001189c1:
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
LAB_001189d3:
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)((s->_M_dataplus)._M_p + s->_M_string_length));
  }
  std::__cxx11::string::push_back(cVar2);
  return;
}

Assistant:

void serialize_str(const std::string& s, Iter oi) {
    *oi++ = '"';
    for (std::string::const_iterator i = s.begin(); i != s.end(); ++i) {
      switch (*i) {
#define MAP(val, sym) case val: copy(sym, oi); break
    MAP('"', "\\\"");
    MAP('\\', "\\\\");
    MAP('/', "\\/");
    MAP('\b', "\\b");
    MAP('\f', "\\f");
    MAP('\n', "\\n");
    MAP('\r', "\\r");
    MAP('\t', "\\t");
#undef MAP
      default:
    if (static_cast<unsigned char>(*i) < 0x20 || *i == 0x7f) {
      char buf[7];
      SNPRINTF(buf, sizeof(buf), "\\u%04x", *i & 0xff);
      copy(buf, buf + 6, oi);
      } else {
      *oi++ = *i;
    }
    break;
      }
    }
    *oi++ = '"';
  }